

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

Real Diffusion::get_scaled_abs_tol(MultiFab *rhs,Real reduction)

{
  int iVar1;
  int iVar2;
  FabArrayBase *in_RDI;
  double in_XMM0_Qa;
  Real RVar3;
  int comp;
  Real rhs_avg_norm;
  Real oncomp;
  undefined1 in_stack_000002ee;
  undefined1 in_stack_000002ef;
  int in_stack_000002f0;
  int in_stack_000002f4;
  MultiFab *in_stack_000002f8;
  undefined4 local_24;
  undefined8 local_20;
  
  iVar1 = amrex::FabArrayBase::nComp(in_RDI);
  local_20 = 0.0;
  local_24 = 0;
  while( true ) {
    iVar2 = amrex::FabArrayBase::nComp(in_RDI);
    if (iVar2 <= local_24) break;
    RVar3 = amrex::MultiFab::norm0
                      (in_stack_000002f8,in_stack_000002f4,in_stack_000002f0,(bool)in_stack_000002ef
                       ,(bool)in_stack_000002ee);
    local_20 = (1.0 / (double)iVar1) * RVar3 + local_20;
    local_24 = local_24 + 1;
  }
  return in_XMM0_Qa * local_20;
}

Assistant:

Real
Diffusion::get_scaled_abs_tol (const MultiFab& rhs,
                               Real            reduction) //const
{
    Real oncomp(1.0/rhs.nComp());
    Real rhs_avg_norm(0.0);
    // Let's take an average on all the components
    // This is the only way I can think of to prevent absolute tolerance to be
    // execessively small
    for (int comp(0); comp < rhs.nComp(); ++comp)
        rhs_avg_norm += oncomp * rhs.norm0(comp,0,false,true);
    return reduction * rhs_avg_norm;
}